

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O2

void __thiscall
pstack::Procman::Process::addElfObject(Process *this,string_view name,sptr *obj,Addr load)

{
  long *plVar1;
  ostream *poVar2;
  undefined1 local_180 [8];
  IOFlagSave _;
  
  MappedObject::MappedObject((MappedObject *)&_.field_0x108,name,obj);
  local_180 = (undefined1  [8])load;
  MappedObject::MappedObject((MappedObject *)&_,(MappedObject *)&_.field_0x108);
  std::
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,pstack::Procman::MappedObject>,std::_Select1st<std::pair<unsigned_long_const,pstack::Procman::MappedObject>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,pstack::Procman::MappedObject>>>
  ::_M_emplace_unique<std::pair<unsigned_long,pstack::Procman::MappedObject>>
            ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,pstack::Procman::MappedObject>,std::_Select1st<std::pair<unsigned_long_const,pstack::Procman::MappedObject>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,pstack::Procman::MappedObject>>>
              *)&this->objects,(pair<unsigned_long,_pstack::Procman::MappedObject> *)local_180);
  MappedObject::~MappedObject((MappedObject *)&_);
  MappedObject::~MappedObject((MappedObject *)&_.field_0x108);
  if (1 < *(int *)(this->context + 0xa0)) {
    plVar1 = *(long **)(this->context + 0x78);
    IOFlagSave::IOFlagSave
              ((IOFlagSave *)local_180,(ios *)((long)plVar1 + *(long *)(*plVar1 + -0x18)));
    poVar2 = std::operator<<(*(ostream **)(this->context + 0x78),"object ");
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,name._M_str,name._M_len);
    poVar2 = std::operator<<(poVar2," loaded at address ");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::endl<char,std::char_traits<char>>(poVar2);
    IOFlagSave::~IOFlagSave((IOFlagSave *)local_180);
  }
  return;
}

Assistant:

void
Process::addElfObject(std::string_view name, const Elf::Object::sptr &obj, Elf::Addr load)
{
    objects.emplace(std::make_pair(load, MappedObject{ name, obj }));
    if (context.verbose >= 2) {
        IOFlagSave _(*context.debug);
        *context.debug << "object " << name << " loaded at address "
           << std::hex << load << std::dec << std::endl;
    }
}